

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogWriter.h
# Opt level: O3

void __thiscall LogWriter::finish(LogWriter *this)

{
  ofstream *poVar1;
  char cVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  
  poVar1 = &this->logfile_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,">--",3);
  this->iteration_ = this->iteration_ + 1;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"--<",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  cVar2 = (char)poVar1;
  for (p_Var4 = (this->vertices_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->vertices_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ->",3);
    for (p_Var5 = p_Var4[1]._M_parent; p_Var5 != (_Base_ptr)&p_Var4[1]._M_parent;
        p_Var5 = *(_Base_ptr *)p_Var5) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," ",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"---",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->logfile_ + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  for (p_Var4 = (this->cliques_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->cliques_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    for (p_Var5 = p_Var4[1]._M_parent; p_Var5 != (_Base_ptr)&p_Var4[1]._M_parent;
        p_Var5 = *(_Base_ptr *)p_Var5) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," ",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  return;
}

Assistant:

void finish() {
        logfile_ << ">--" << iteration_++ << "--<" << std::endl;

        for (const auto& adj : vertices_) {
            logfile_ << adj.first << " ->";
            for (const auto& i : adj.second) {
                logfile_ << " " << i;
            }
            logfile_ << std::endl;
        }

        logfile_ << "---" << std::endl;

        for (const auto& cl : cliques_) {
            logfile_ << cl.first << ":";
            for (const auto& i : cl.second) {
                logfile_ << " " << i;
            }
            logfile_ << std::endl;
        }

    }